

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlChar * xmlSplitQName3(xmlChar *name,int *len)

{
  bool bVar1;
  int local_24;
  int l;
  int *len_local;
  xmlChar *name_local;
  
  local_24 = 0;
  if (name == (xmlChar *)0x0) {
    name_local = (xmlChar *)0x0;
  }
  else if (len == (int *)0x0) {
    name_local = (xmlChar *)0x0;
  }
  else if (*name == ':') {
    name_local = (xmlChar *)0x0;
  }
  else {
    while( true ) {
      bVar1 = false;
      if (name[local_24] != '\0') {
        bVar1 = name[local_24] != ':';
      }
      if (!bVar1) break;
      local_24 = local_24 + 1;
    }
    if (name[local_24] == '\0') {
      name_local = (xmlChar *)0x0;
    }
    else {
      *len = local_24;
      name_local = name + (local_24 + 1);
    }
  }
  return name_local;
}

Assistant:

const xmlChar *
xmlSplitQName3(const xmlChar *name, int *len) {
    int l = 0;

    if (name == NULL) return(NULL);
    if (len == NULL) return(NULL);

    /* nasty but valid */
    if (name[0] == ':')
	return(NULL);

    /*
     * we are not trying to validate but just to cut, and yes it will
     * work even if this is as set of UTF-8 encoded chars
     */
    while ((name[l] != 0) && (name[l] != ':'))
	l++;

    if (name[l] == 0)
	return(NULL);

    *len = l;

    return(&name[l+1]);
}